

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

void tf::detail::
     parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (undefined8 *rt,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,int param_4,
               uint param_5)

{
  int *piVar1;
  int iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  int iVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar15;
  _Iter_comp_iter<std::less<int>_> __cmp;
  int local_98;
  DefaultTaskParams local_91;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  uint local_84;
  undefined8 *local_80;
  anon_class_64_6_4db4d30f local_78;
  
  uVar10 = (long)end._M_current - (long)begin._M_current >> 2;
  local_98 = param_4;
  local_90._M_current = end._M_current;
  local_80 = rt;
  if (uVar10 < 0x18) {
    if ((char)param_5 == '\0') {
LAB_0012698e:
      piVar9 = begin._M_current + 1;
      if (begin._M_current + 1 == end._M_current || begin._M_current == end._M_current) {
        return;
      }
      do {
        piVar11 = piVar9;
        iVar13 = *begin._M_current;
        iVar7 = begin._M_current[1];
        piVar9 = piVar11;
        if (iVar7 < iVar13) {
          do {
            *piVar9 = iVar13;
            iVar13 = piVar9[-2];
            piVar9 = piVar9 + -1;
          } while (iVar7 < iVar13);
          *piVar9 = iVar7;
        }
        piVar9 = piVar11 + 1;
        begin._M_current = piVar11;
      } while (piVar11 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      if (uVar10 < 0x1001) {
        if (begin._M_current == end._M_current) {
          return;
        }
        lVar4 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                  (begin._M_current,end._M_current,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                  (begin._M_current,end._M_current);
        return;
      }
      uVar5 = uVar10 >> 1;
      iVar7 = begin._M_current[uVar5];
      iVar13 = *begin._M_current;
      if (iVar7 < iVar13) {
        *begin._M_current = iVar7;
        begin._M_current[uVar5] = iVar13;
        iVar7 = iVar13;
      }
      if (end._M_current[-1] < iVar7) {
        begin._M_current[uVar5] = end._M_current[-1];
        end._M_current[-1] = iVar7;
        iVar7 = begin._M_current[uVar5];
      }
      iVar13 = *begin._M_current;
      if (iVar7 < iVar13) {
        *begin._M_current = iVar7;
        begin._M_current[uVar5] = iVar13;
      }
      iVar7 = begin._M_current[uVar5 - 1];
      iVar13 = begin._M_current[1];
      if (iVar7 < iVar13) {
        begin._M_current[1] = iVar7;
        begin._M_current[uVar5 - 1] = iVar13;
        iVar7 = iVar13;
      }
      if (end._M_current[-2] < iVar7) {
        begin._M_current[uVar5 - 1] = end._M_current[-2];
        end._M_current[-2] = iVar7;
        iVar7 = begin._M_current[uVar5 - 1];
      }
      iVar13 = begin._M_current[1];
      if (iVar7 < iVar13) {
        begin._M_current[1] = iVar7;
        begin._M_current[uVar5 - 1] = iVar13;
      }
      iVar7 = begin._M_current[uVar5 + 1];
      iVar13 = begin._M_current[2];
      if (iVar7 < iVar13) {
        begin._M_current[2] = iVar7;
        begin._M_current[uVar5 + 1] = iVar13;
        iVar7 = iVar13;
      }
      if (end._M_current[-3] < iVar7) {
        begin._M_current[uVar5 + 1] = end._M_current[-3];
        end._M_current[-3] = iVar7;
        iVar7 = begin._M_current[uVar5 + 1];
      }
      iVar13 = begin._M_current[2];
      if (iVar7 < iVar13) {
        begin._M_current[2] = iVar7;
        begin._M_current[uVar5 + 1] = iVar13;
        iVar7 = iVar13;
      }
      iVar2 = begin._M_current[uVar5 - 1];
      iVar13 = begin._M_current[uVar5];
      iVar8 = iVar13;
      if (iVar13 < iVar2) {
        begin._M_current[uVar5 - 1] = iVar13;
        begin._M_current[uVar5] = iVar2;
        iVar8 = iVar2;
        iVar2 = iVar13;
      }
      if (iVar7 < iVar8) {
        begin._M_current[uVar5] = iVar7;
        begin._M_current[uVar5 + 1] = iVar8;
        iVar8 = iVar7;
      }
      if (iVar8 < iVar2) {
        begin._M_current[uVar5 - 1] = iVar8;
        begin._M_current[uVar5] = iVar2;
        iVar8 = iVar2;
      }
      iVar7 = *begin._M_current;
      *begin._M_current = iVar8;
      begin._M_current[uVar5] = iVar7;
      if (((param_5 & 1) == 0) && (*begin._M_current <= begin._M_current[-1])) {
        begin = partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                          (begin._M_current,end._M_current);
        begin._M_current = begin._M_current + 1;
        uVar10 = (long)end._M_current - (long)begin._M_current >> 2;
      }
      else {
        local_84 = param_5;
        pVar15 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                           (begin._M_current,end._M_current);
        __last._M_current = local_90._M_current;
        _Var6 = pVar15.first._M_current;
        uVar5 = (long)_Var6._M_current - (long)begin._M_current >> 2;
        piVar9 = _Var6._M_current + 1;
        uVar14 = (long)end._M_current - (long)piVar9 >> 2;
        end._M_current = local_90._M_current;
        if ((uVar5 < uVar10 >> 3) || (uVar14 < uVar10 >> 3)) {
          local_98 = local_98 + -1;
          if (local_98 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,local_90,(_Iter_comp_iter<std::less<int>_> *)&local_78);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,__last,(_Iter_comp_iter<std::less<int>_> *)&local_78);
            return;
          }
          if (0x17 < uVar5) {
            uVar10 = uVar5 & 0xfffffffffffffffc;
            iVar7 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar10);
            *(begin._M_current + uVar10) = iVar7;
            iVar7 = _Var6._M_current[-1];
            _Var6._M_current[-1] = *(_Var6._M_current - uVar10);
            *(_Var6._M_current - uVar10) = iVar7;
            if (0x80 < uVar5) {
              uVar5 = uVar5 >> 2;
              iVar7 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar5 + 1];
              begin._M_current[uVar5 + 1] = iVar7;
              iVar7 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar5 + 2];
              begin._M_current[uVar5 + 2] = iVar7;
              iVar7 = _Var6._M_current[-2];
              _Var6._M_current[-2] = _Var6._M_current[~uVar5];
              _Var6._M_current[~uVar5] = iVar7;
              iVar7 = _Var6._M_current[-3];
              _Var6._M_current[-3] = _Var6._M_current[-2 - uVar5];
              _Var6._M_current[-2 - uVar5] = iVar7;
            }
          }
          if (0x17 < uVar14) {
            uVar10 = uVar14 & 0xfffffffffffffffc;
            iVar7 = _Var6._M_current[1];
            _Var6._M_current[1] = *(_Var6._M_current + uVar10 + 4);
            *(_Var6._M_current + uVar10 + 4) = iVar7;
            iVar7 = local_90._M_current[-1];
            local_90._M_current[-1] = *(local_90._M_current - uVar10);
            *(local_90._M_current - uVar10) = iVar7;
            if (0x80 < uVar14) {
              uVar10 = uVar14 >> 2;
              iVar7 = _Var6._M_current[2];
              _Var6._M_current[2] = _Var6._M_current[uVar10 + 2];
              _Var6._M_current[uVar10 + 2] = iVar7;
              iVar7 = _Var6._M_current[3];
              _Var6._M_current[3] = _Var6._M_current[uVar10 + 3];
              _Var6._M_current[uVar10 + 3] = iVar7;
              iVar7 = local_90._M_current[-2];
              local_90._M_current[-2] = local_90._M_current[~uVar10];
              local_90._M_current[~uVar10] = iVar7;
              iVar7 = local_90._M_current[-3];
              local_90._M_current[-3] = local_90._M_current[-2 - uVar10];
              local_90._M_current[-2 - uVar10] = iVar7;
            }
          }
        }
        else if (((((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                 (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                    (begin._M_current,_Var6._M_current),
                 end._M_current = local_90._M_current, bVar3)) &&
                (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                   (piVar9,local_90._M_current), bVar3)) {
          return;
        }
        local_78.rt._executor = (Executor *)*local_80;
        local_78.rt._17_8_ = *(undefined8 *)((long)local_80 + 0x11);
        local_78.rt._parent._0_1_ = (undefined1)((ulong)*(undefined8 *)((long)local_80 + 9) >> 0x38)
        ;
        local_78.rt._worker._0_1_ = (undefined1)local_80[1];
        local_78.rt._worker._1_7_ = (undefined7)((ulong)local_80[1] >> 8);
        local_78.leftmost = (bool)((byte)local_84 & 1);
        LOCK();
        *(long *)(local_80[2] + 0x80) = *(long *)(local_80[2] + 0x80) + 1;
        UNLOCK();
        local_78.begin._M_current = begin._M_current;
        local_78.pivot_pos._M_current = _Var6._M_current;
        local_78.bad_allowed = local_98;
        Executor::
        _silent_async<tf::DefaultTaskParams,tf::detail::parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>(tf::Runtime&,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,int,bool)::_lambda()_1_>
                  ((Executor *)*local_80,&local_91,&local_78,((Node *)local_80[2])->_topology,
                   (Node *)local_80[2]);
        param_5 = 0;
        begin._M_current = piVar9;
        uVar10 = uVar14;
      }
    } while (0x17 < uVar10);
    if ((param_5 & 1) == 0) goto LAB_0012698e;
  }
  if (begin._M_current + 1 != end._M_current && begin._M_current != end._M_current) {
    lVar4 = 4;
    piVar9 = begin._M_current;
    piVar11 = begin._M_current + 1;
    do {
      iVar13 = *piVar9;
      iVar7 = piVar9[1];
      lVar12 = lVar4;
      if (iVar7 < iVar13) {
        do {
          *(begin._M_current + lVar12) = iVar13;
          piVar9 = begin._M_current;
          if (lVar12 == 4) goto LAB_001265e2;
          iVar13 = *(begin._M_current + lVar12 + -8);
          lVar12 = lVar12 + -4;
        } while (iVar7 < iVar13);
        piVar9 = lVar12 + begin._M_current;
LAB_001265e2:
        *piVar9 = iVar7;
      }
      piVar1 = piVar11 + 1;
      lVar4 = lVar4 + 4;
      piVar9 = piVar11;
      piVar11 = piVar1;
    } while (piVar1 != end._M_current);
  }
  return;
}

Assistant:

void parallel_pdqsort(
  Runtime& rt,
  Iter begin, Iter end, Compare comp,
  int bad_allowed, bool leftmost = true
) {

  // Partitions below this size are sorted sequentially
  constexpr auto cutoff = parallel_sort_cutoff<Iter>();

  // Partitions below this size are sorted using insertion sort
  constexpr auto insertion_sort_threshold = 24;

  // Partitions above this size use Tukey's ninther to select the pivot.
  constexpr auto ninther_threshold = 128;

  //using diff_t = typename std::iterator_traits<Iter>::difference_type;

  // Use a while loop for tail recursion elimination.
  while (true) {

    //diff_t size = end - begin;
    size_t size = end - begin;

    // Insertion sort is faster for small arrays.
    if (size < insertion_sort_threshold) {
      if (leftmost) {
        insertion_sort(begin, end, comp);
      }
      else {
        unguarded_insertion_sort(begin, end, comp);
      }
      return;
    }

    if(size <= cutoff) {
      std::sort(begin, end, comp);
      return;
    }

    // Choose pivot as median of 3 or pseudomedian of 9.
    //diff_t s2 = size / 2;
    size_t s2 = size >> 1;
    if (size > ninther_threshold) {
      sort3(begin, begin + s2, end - 1, comp);
      sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
      sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
      sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
      std::iter_swap(begin, begin + s2);
    }
    else {
      sort3(begin + s2, begin, end - 1, comp);
    }

    // If *(begin - 1) is the end of the right partition
    // of a previous partition operation, there is no element in [begin, end)
    // that is smaller than *(begin - 1).
    // Then if our pivot compares equal to *(begin - 1) we change strategy,
    // putting equal elements in the left partition,
    // greater elements in the right partition.
    // We do not have to recurse on the left partition,
    // since it's sorted (all equal).
    if (!leftmost && !comp(*(begin - 1), *begin)) {
      begin = partition_left(begin, end, comp) + 1;
      continue;
    }

    // Partition and get results.
    const auto pair = Branchless ? partition_right_branchless(begin, end, comp) :
                                   partition_right(begin, end, comp);
       
    const auto pivot_pos = pair.first;
    const auto already_partitioned = pair.second;

    // Check for a highly unbalanced partition.
    //diff_t l_size = pivot_pos - begin;
    //diff_t r_size = end - (pivot_pos + 1);
    const size_t l_size = pivot_pos - begin;
    const size_t r_size = end - (pivot_pos + 1);
    const bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

    // If we got a highly unbalanced partition we shuffle elements
    // to break many patterns.
    if (highly_unbalanced) {
      // If we had too many bad partitions, switch to heapsort
      // to guarantee O(n log n).
      if (--bad_allowed == 0) {
        std::make_heap(begin, end, comp);
        std::sort_heap(begin, end, comp);
        return;
      }

      if (l_size >= insertion_sort_threshold) {
        std::iter_swap(begin, begin + l_size / 4);
        std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);
        if (l_size > ninther_threshold) {
          std::iter_swap(begin + 1, begin + (l_size / 4 + 1));
          std::iter_swap(begin + 2, begin + (l_size / 4 + 2));
          std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
          std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
        }
      }

      if (r_size >= insertion_sort_threshold) {
        std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
        std::iter_swap(end - 1,                   end - r_size / 4);
        if (r_size > ninther_threshold) {
          std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
          std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
          std::iter_swap(end - 2,             end - (1 + r_size / 4));
          std::iter_swap(end - 3,             end - (2 + r_size / 4));
        }
      }
    }
    // decently balanced
    else {
      // sequence try to use insertion sort.
      if (already_partitioned &&
          partial_insertion_sort(begin, pivot_pos, comp) &&
          partial_insertion_sort(pivot_pos + 1, end, comp)
      ) {
        return;
      }
    }

    // Sort the left partition first using recursion and
    // do tail recursion elimination for the right-hand partition.
    // here we need to copy runtime so it stays alive during the sort recursion
    rt.silent_async([=] () mutable {
      parallel_pdqsort<Iter, Compare, Branchless>(
        rt, begin, pivot_pos, comp, bad_allowed, leftmost
      );
    });
    begin = pivot_pos + 1;
    leftmost = false;
  }
}